

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_json_generator.cc
# Opt level: O1

void __thiscall t_json_generator::merge_includes(t_json_generator *this,t_program *program)

{
  t_program *program_00;
  pointer pptVar1;
  pointer pptVar2;
  pointer pptVar3;
  pointer pptVar4;
  pointer pptVar5;
  pointer pptVar6;
  vector<t_service_*,_std::allocator<t_service_*>_> services;
  vector<t_const_*,_std::allocator<t_const_*>_> consts;
  vector<t_struct_*,_std::allocator<t_struct_*>_> objects;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> typedefs;
  vector<t_enum_*,_std::allocator<t_enum_*>_> enums;
  vector<t_program_*,_std::allocator<t_program_*>_> includes;
  vector<t_service_*,_std::allocator<t_service_*>_> local_c0;
  vector<t_const_*,_std::allocator<t_const_*>_> local_a8;
  vector<t_struct_*,_std::allocator<t_struct_*>_> local_90;
  vector<t_typedef_*,_std::allocator<t_typedef_*>_> local_78;
  vector<t_enum_*,_std::allocator<t_enum_*>_> local_60;
  vector<t_program_*,_std::allocator<t_program_*>_> local_48;
  
  std::vector<t_program_*,_std::allocator<t_program_*>_>::vector(&local_48,&program->includes_);
  if (local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start !=
      local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pptVar6 = local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      program_00 = *pptVar6;
      merge_includes(this,program_00);
      std::vector<t_enum_*,_std::allocator<t_enum_*>_>::vector(&local_60,&program_00->enums_);
      for (pptVar1 = local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar1 !=
          local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar1 = pptVar1 + 1) {
        t_program::add_enum(program,*pptVar1);
      }
      std::vector<t_typedef_*,_std::allocator<t_typedef_*>_>::vector
                (&local_78,&program_00->typedefs_);
      for (pptVar2 = local_78.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar2 !=
          local_78.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar2 = pptVar2 + 1) {
        t_program::add_typedef(program,*pptVar2);
      }
      std::vector<t_struct_*,_std::allocator<t_struct_*>_>::vector(&local_90,&program_00->objects_);
      for (pptVar3 = local_90.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar3 !=
          local_90.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar3 = pptVar3 + 1) {
        t_program::add_struct(program,*pptVar3);
      }
      std::vector<t_const_*,_std::allocator<t_const_*>_>::vector(&local_a8,&program_00->consts_);
      for (pptVar4 = local_a8.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar4 !=
          local_a8.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
        t_program::add_const(program,*pptVar4);
      }
      std::vector<t_service_*,_std::allocator<t_service_*>_>::vector
                (&local_c0,&program_00->services_);
      for (pptVar5 = local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          pptVar5 !=
          local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
          super__Vector_impl_data._M_finish; pptVar5 = pptVar5 + 1) {
        t_program::add_service(program,*pptVar5);
      }
      if (local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_c0.super__Vector_base<t_service_*,_std::allocator<t_service_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a8.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a8.super__Vector_base<t_const_*,_std::allocator<t_const_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_90.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_90.super__Vector_base<t_struct_*,_std::allocator<t_struct_*>_>._M_impl
                        .super__Vector_impl_data._M_start);
      }
      if (local_78.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<t_typedef_*,_std::allocator<t_typedef_*>_>.
                        _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<t_enum_*,_std::allocator<t_enum_*>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      pptVar6 = pptVar6 + 1;
    } while (pptVar6 !=
             local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  if (local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<t_program_*,_std::allocator<t_program_*>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void t_json_generator::merge_includes(t_program* program) {
  vector<t_program*> includes = program->get_includes();
  vector<t_program*>::iterator inc_iter;
  for (inc_iter = includes.begin(); inc_iter != includes.end(); ++inc_iter) {
    t_program* include = *inc_iter;
    // recurse in case we get crazy
    merge_includes(include);
    // merge enums
    vector<t_enum*> enums = include->get_enums();
    vector<t_enum*>::iterator en_iter;
    for (en_iter = enums.begin(); en_iter != enums.end(); ++en_iter) {
      program->add_enum(*en_iter);
    }
    // merge typedefs
    vector<t_typedef*> typedefs = include->get_typedefs();
    vector<t_typedef*>::iterator td_iter;
    for (td_iter = typedefs.begin(); td_iter != typedefs.end(); ++td_iter) {
      program->add_typedef(*td_iter);
    }
    // merge structs
    vector<t_struct*> objects = include->get_objects();
    vector<t_struct*>::iterator o_iter;
    for (o_iter = objects.begin(); o_iter != objects.end(); ++o_iter) {
      program->add_struct(*o_iter);
    }
    // merge constants
    vector<t_const*> consts = include->get_consts();
    vector<t_const*>::iterator c_iter;
    for (c_iter = consts.begin(); c_iter != consts.end(); ++c_iter) {
      program->add_const(*c_iter);
    }

    // merge services
    vector<t_service*> services = include->get_services();
    vector<t_service*>::iterator sv_iter;
    for (sv_iter = services.begin(); sv_iter != services.end(); ++sv_iter) {
      program->add_service(*sv_iter);
    }
  }
}